

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

void __thiscall zsummer::log4z::CLock::CLock(CLock *this)

{
  pthread_mutexattr_t local_14;
  CLock *pCStack_10;
  pthread_mutexattr_t attr;
  CLock *this_local;
  
  this->_vptr_CLock = (_func_int **)&PTR__CLock_00155cf8;
  pCStack_10 = this;
  pthread_mutexattr_init(&local_14);
  pthread_mutexattr_settype(&local_14,1);
  pthread_mutex_init((pthread_mutex_t *)&this->m_crit,&local_14);
  pthread_mutexattr_destroy(&local_14);
  return;
}

Assistant:

CLock()
	{
#ifdef WIN32
		InitializeCriticalSection(&m_crit);
#else
		//m_crit = PTHREAD_RECURSIVE_MUTEX_INITIALIZER_NP;
		pthread_mutexattr_t attr;
		pthread_mutexattr_init(&attr);
		pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
		pthread_mutex_init(&m_crit, &attr);
		pthread_mutexattr_destroy(&attr);
#endif
	}